

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcheckedint_impl.h
# Opt level: O2

void __thiscall QMainWindowLayout::restore(QMainWindowLayout *this,bool keepSavedState)

{
  if ((*(int *)(this + 0x3c0) <= *(int *)(this + 0x3c8)) &&
     (*(int *)(this + 0x3c4) <= *(int *)(this + 0x3cc))) {
    QMainWindowLayoutState::operator=
              ((QMainWindowLayoutState *)(this + 0x88),(QMainWindowLayoutState *)(this + 0x3c0));
    applyState(this,(QMainWindowLayoutState *)(this + 0x88),true);
    if (!keepSavedState) {
      QMainWindowLayoutState::clear((QMainWindowLayoutState *)(this + 0x3c0));
    }
    QList<int>::clear((QList<int> *)(this + 0x7b0));
    *(undefined8 *)(this + 0x7d8) = 0;
    updateGapIndicator(this);
    return;
  }
  return;
}

Assistant:

Q_DECLARE_STRONGLY_ORDERED_LITERAL_TYPE(
        QCheckedInt,
        AInt,
        template <typename AInt, if_is_same_int<AInt> = true>)
};

template <typename Int, typename I, typename P>
Q_DECL_CONST_FUNCTION size_t constexpr inline qHash(QCheckedInt<Int, I, P> key, size_t seed = 0) noexcept
{
    using QT_PREPEND_NAMESPACE(qHash);
    return qHash(key.value(), seed);
}